

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaIDCAugPtr_conflict *ppxVar1;
  xmlNodePtr ctxtNode;
  xmlSchemaParserCtxtPtr pctxt;
  xmlDocPtr pxVar2;
  xmlSchemaIDCPtr_conflict pxVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  xmlChar *location;
  xmlSchemaElementPtr pxVar9;
  xmlSchemaTypePtr pxVar10;
  xmlRegExecCtxtPtr exec;
  xmlSchemaTypePtr type;
  xmlSchemaIDCAugPtr_conflict pxVar11;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlSchemaNodeInfoPtr pxVar12;
  xmlSchemaNodeInfoPtr pxVar13;
  long lVar14;
  char *pcVar15;
  xmlSchemaValPtr *retVal;
  xmlSchemaAttrInfoPtr pxVar16;
  xmlParserErrors xVar17;
  char *pcVar18;
  xmlSchemaIDCMatcherPtr_conflict pxVar19;
  xmlSchemaIDCMatcherPtr *ppxVar20;
  char *in_R8;
  int *piVar21;
  xmlSchemaIDCAugPtr_conflict pxVar22;
  byte *name;
  byte *pbVar23;
  xmlSchemaIDCPtr_conflict pxVar24;
  bool bVar25;
  int nbval;
  int terminal;
  xmlChar *values [10];
  xmlNodePtr in_stack_ffffffffffffff28;
  xmlChar **in_stack_ffffffffffffff30;
  xmlChar *local_b0;
  uint local_a4;
  xmlSchemaPtr local_a0;
  xmlSchemaValPtr *local_98;
  uint local_90;
  int local_8c;
  xmlSchemaTypePtr local_88 [11];
  
  iVar6 = (int)in_stack_ffffffffffffff28;
  if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) {
    pcVar18 = "xmlSchemaValidateElem";
    pcVar15 = "in skip-state";
    goto LAB_001a4e35;
  }
  if (vctxt->xsiAssemble != 0) {
    lVar7 = (long)vctxt->nbAttrInfos;
    if (0 < lVar7) {
      lVar14 = 0;
      do {
        pxVar16 = vctxt->attrInfos[lVar14];
        if (pxVar16->metaType == 3) goto LAB_001a4088;
        lVar14 = lVar14 + 1;
      } while (lVar7 != lVar14);
      lVar14 = 0;
      do {
        pxVar16 = vctxt->attrInfos[lVar14];
        if (pxVar16->metaType == 4) goto LAB_001a4088;
        lVar14 = lVar14 + 1;
      } while (lVar7 != lVar14);
    }
    goto LAB_001a435b;
  }
  goto LAB_001a4372;
code_r0x001a4ad9:
  lVar7 = lVar7 + 1;
  if (vctxt->nbAttrInfos == lVar7) goto LAB_001a4b1e;
  goto LAB_001a4acf;
LAB_001a4dab:
  pcVar15 = "Could not find an augmented IDC item for an IDC definition";
  goto LAB_001a4db9;
LAB_001a4088:
  pbVar23 = pxVar16->value;
  local_b0 = (xmlChar *)0x0;
  iVar4 = 0;
  do {
    iVar6 = (int)in_stack_ffffffffffffff28;
    name = pbVar23;
    if (pxVar16->metaType == 3) {
      while ((uVar8 = (ulong)*name, uVar8 < 0x21 && ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0))) {
        name = name + 1;
      }
      lVar7 = 0;
      while ((0x20 < (byte)uVar8 || ((0x100002601U >> (uVar8 & 0x3f) & 1) == 0))) {
        lVar14 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        uVar8 = (ulong)name[lVar14];
      }
      if (lVar7 == 0) break;
      pbVar23 = name + lVar7;
      local_b0 = xmlDictLookup(vctxt->schema->dict,name,(int)lVar7);
    }
    while( true ) {
      iVar6 = (int)in_stack_ffffffffffffff28;
      uVar8 = (ulong)*pbVar23;
      if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) break;
      pbVar23 = pbVar23 + 1;
    }
    lVar7 = 0;
    while ((0x20 < (byte)uVar8 || ((0x100002601U >> (uVar8 & 0x3f) & 1) == 0))) {
      lVar14 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      uVar8 = (ulong)pbVar23[lVar14];
    }
    if (lVar7 == 0) {
      if (pxVar16->metaType == 3) {
        iVar6 = 0;
        in_R8 = (char *)0x0;
        xmlSchemaCustomWarning
                  ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_MISC,pxVar16->node,
                   (xmlSchemaTypePtr)
                   "The value must consist of tuples: the target namespace name and the document\'s URI"
                   ,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)in_stack_ffffffffffffff30);
      }
      break;
    }
    location = xmlDictLookup(vctxt->schema->dict,pbVar23,(int)lVar7);
    ctxtNode = pxVar16->node;
    local_88[0] = (xmlSchemaTypePtr)0x0;
    if ((vctxt == (xmlSchemaValidCtxtPtr)0x0) || (vctxt->schema == (xmlSchemaPtr)0x0)) {
LAB_001a45d5:
      pcVar18 = "xmlSchemaAssembleByXSI";
      pcVar15 = "assembling schemata";
      goto LAB_001a4e35;
    }
    pctxt = vctxt->pctxt;
    if (pctxt == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaAssembleByLocation",
                 "no parser context available",(xmlChar *)0x0,(xmlChar *)in_R8);
      goto LAB_001a45d5;
    }
    if (pctxt->constructor == (xmlSchemaConstructionCtxtPtr)0x0) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaAssembleByLocation","no constructor",
                 (xmlChar *)0x0,(xmlChar *)in_R8);
      goto LAB_001a45d5;
    }
    local_a0 = vctxt->schema;
    local_98 = (xmlSchemaValPtr *)xmlSchemaBuildAbsoluteURI(pctxt->dict,location,ctxtNode);
    in_stack_ffffffffffffff30 = (xmlChar **)0x0;
    in_R8 = (char *)0x0;
    in_stack_ffffffffffffff28 = ctxtNode;
    iVar4 = xmlSchemaAddSchemaDoc
                      (pctxt,1,(xmlChar *)local_98,(xmlDocPtr)0x0,(char *)0x0,0,ctxtNode,
                       (xmlChar *)0x0,local_b0,(xmlSchemaBucketPtr_conflict *)local_88);
    if (iVar4 == 0) {
      in_R8 = (char *)local_98;
      if (local_88[0] == (xmlSchemaTypePtr)0x0) {
        in_stack_ffffffffffffff28 = (xmlNodePtr)0x0;
        xmlSchemaCustomWarning
                  ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_MISC,ctxtNode,
                   (xmlSchemaTypePtr)"The document at location \'%s\' could not be acquired",
                   (char *)local_98,(xmlChar *)0x0,(xmlChar *)0x0,
                   (xmlChar *)in_stack_ffffffffffffff30);
      }
      else {
        if (pctxt->constructor->bucket == (xmlSchemaBucketPtr_conflict)0x0) {
          pctxt->constructor->bucket = (xmlSchemaBucketPtr_conflict)local_88[0];
        }
        pxVar2 = (xmlDocPtr)local_88[0]->ref;
        if ((pxVar2 != (xmlDocPtr)0x0) && (*(int *)((long)&local_88[0]->annot + 4) == 0)) {
          pctxt->err = 0;
          pctxt->nberrors = 0;
          pctxt->doc = pxVar2;
          iVar4 = xmlSchemaParseNewDocWithContext
                            (pctxt,local_a0,(xmlSchemaBucketPtr_conflict)local_88[0]);
          if (iVar4 == 0) {
            iVar6 = pctxt->nberrors;
            if (iVar6 == 0) {
LAB_001a42d9:
              xmlSchemaFixupComponents(pctxt,(xmlSchemaBucketPtr_conflict)local_88[0]);
              iVar4 = pctxt->err;
              if ((iVar4 != 0) && (vctxt->err == 0)) {
                vctxt->err = iVar4;
              }
              iVar6 = pctxt->nberrors;
            }
            else {
              iVar4 = pctxt->err;
            }
          }
          else {
            if (iVar4 == -1) {
              pctxt->doc = (xmlDocPtr)0x0;
              goto LAB_001a45d5;
            }
            iVar6 = pctxt->nberrors;
            if (iVar6 == 0) goto LAB_001a42d9;
          }
          vctxt->nberrors = vctxt->nberrors + iVar6;
          pctxt->doc = (xmlDocPtr)0x0;
          goto LAB_001a41fd;
        }
      }
      iVar4 = 0;
    }
    else {
LAB_001a41fd:
      if (iVar4 == -1) goto LAB_001a45d5;
    }
    iVar6 = (int)in_stack_ffffffffffffff28;
    pbVar23 = pbVar23 + lVar7;
  } while (*pbVar23 != 0);
  if (iVar4 == -1) {
    return -1;
  }
  if (iVar4 != 0) {
    vctxt->skipDepth = 0;
    return iVar4;
  }
LAB_001a435b:
  xmlHashScan(vctxt->schema->schemasImports,xmlSchemaAugmentImportedIDC,vctxt);
LAB_001a4372:
  if ((long)vctxt->depth < 1) {
    pxVar9 = xmlSchemaGetElem(vctxt->schema,vctxt->inode->localName,vctxt->inode->nsName);
    pxVar12 = vctxt->inode;
    pxVar12->decl = pxVar9;
    if (pxVar9 == (xmlSchemaElementPtr)0x0) {
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,
                          "No matching global declaration available for the validation root",
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar6 = 0x735;
      goto LAB_001a4d98;
    }
LAB_001a473b:
    if (pxVar9->type == XML_SCHEMA_TYPE_ANY) {
      if (*(int *)&pxVar9->refNs == 1) {
        vctxt->skipDepth = vctxt->depth;
        return 0;
      }
      pxVar10 = (xmlSchemaTypePtr)xmlSchemaGetElem(vctxt->schema,pxVar12->localName,pxVar12->nsName)
      ;
      if (pxVar10 == (xmlSchemaTypePtr)0x0) {
        if (*(int *)&pxVar9->refNs != 3) {
          if (0 < (long)vctxt->nbAttrInfos) {
            lVar7 = 0;
            do {
              if (vctxt->attrInfos[lVar7]->metaType == 1) {
                iVar6 = xmlSchemaProcessXSIType
                                  (vctxt,vctxt->attrInfos[lVar7],&vctxt->inode->typeDef,
                                   (xmlSchemaElementPtr)0x0);
                if (iVar6 != -1) goto LAB_001a4787;
                xmlSchemaInternalErr2
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElemWildcard",
                           "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:nil\'",
                           (xmlChar *)0x0,(xmlChar *)in_R8);
                goto LAB_001a49e8;
              }
              lVar7 = lVar7 + 1;
            } while (vctxt->nbAttrInfos != lVar7);
          }
          pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
          lVar7 = 0x38;
          goto LAB_001a477c;
        }
        in_R8 = 
        "No matching global element declaration available, but demanded by the strict wildcard";
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                            (xmlSchemaBasicItemPtr)0x0,
                            "No matching global element declaration available, but demanded by the strict wildcard"
                            ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        iVar6 = vctxt->err;
        if (iVar6 != 0) {
          if (iVar6 < 0) {
LAB_001a49e8:
            pcVar18 = "xmlSchemaValidateElem";
            pcVar15 = "calling xmlSchemaValidateElemWildcard()";
            goto LAB_001a4e35;
          }
          goto LAB_001a4d98;
        }
      }
      else {
        lVar7 = 0x50;
LAB_001a477c:
        *(xmlSchemaTypePtr *)((long)&vctxt->inode->nodeType + lVar7) = pxVar10;
      }
LAB_001a4787:
      pxVar12 = vctxt->inode;
      pxVar9 = pxVar12->decl;
      if (pxVar9->type != XML_SCHEMA_TYPE_ELEMENT) {
        pxVar12->decl = (xmlSchemaElementPtr)0x0;
        goto LAB_001a4ca9;
      }
    }
    if ((pxVar9->flags & 0x10) != 0) {
      in_R8 = "The element declaration is abstract";
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_2,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,"The element declaration is abstract",
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar6 = vctxt->err;
      if (iVar6 != 0) {
        if (-1 < iVar6) goto LAB_001a4d98;
LAB_001a4e27:
        pcVar18 = "xmlSchemaValidateElem";
        pcVar15 = "calling xmlSchemaValidateElemDecl()";
        goto LAB_001a4e35;
      }
      pxVar12 = vctxt->inode;
      goto LAB_001a4ca9;
    }
    pxVar10 = pxVar9->subtypes;
    if (pxVar10 != (xmlSchemaTypePtr)0x0) {
      if (0 < (long)vctxt->nbAttrInfos) {
        lVar7 = 0;
        do {
          pxVar12 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar7];
          if (*(int *)&pxVar12->field_0x5c == 2) {
            vctxt->inode = pxVar12;
            type = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
            retVal = &pxVar12->val;
            in_R8 = (char *)retVal;
            iVar6 = xmlSchemaVCheckCVCSimpleType
                              ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,type,pxVar12->value,
                               retVal,1,0,0);
            vctxt->inode = vctxt->elemInfos[vctxt->depth];
            if (iVar6 < 0) {
              pcVar15 = 
              "calling xmlSchemaVCheckCVCSimpleType() to validate the attribute \'xsi:nil\'";
              goto LAB_001a4e1d;
            }
            if (iVar6 != 0) break;
            if ((pxVar9->flags & 1) == 0) {
              in_R8 = "The element is not \'nillable\'";
              xVar17 = XML_SCHEMAV_CVC_ELT_3_1;
            }
            else {
              iVar6 = xmlSchemaValueGetAsBoolean(*retVal);
              if (iVar6 == 0) break;
              if (((pxVar9->flags & 8) == 0) || (pxVar9->value == (xmlChar *)0x0)) {
                piVar21 = &vctxt->inode->flags;
                *piVar21 = *piVar21 | 4;
                break;
              }
              in_R8 = 
              "The element cannot be \'nilled\' because there is a fixed value constraint defined for it"
              ;
              xVar17 = XML_SCHEMAV_CVC_ELT_3_2_2;
            }
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar17,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0);
            break;
          }
          lVar7 = lVar7 + 1;
        } while (vctxt->nbAttrInfos != lVar7);
        if (0 < (long)vctxt->nbAttrInfos) {
          lVar7 = 0;
LAB_001a4acf:
          if (vctxt->attrInfos[lVar7]->metaType != 1) goto code_r0x001a4ad9;
          local_88[0] = (xmlSchemaTypePtr)0x0;
          iVar6 = xmlSchemaProcessXSIType(vctxt,vctxt->attrInfos[lVar7],local_88,pxVar9);
          if (iVar6 == -1) {
            pcVar15 = "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:type\'";
LAB_001a4e1d:
            pcVar18 = "xmlSchemaValidateElemDecl";
            goto LAB_001a4e20;
          }
          if (local_88[0] != (xmlSchemaTypePtr)0x0) {
            piVar21 = &vctxt->inode->flags;
            *piVar21 = *piVar21 | 8;
            pxVar10 = local_88[0];
          }
        }
      }
LAB_001a4b1e:
      pxVar24 = (xmlSchemaIDCPtr_conflict)pxVar9->idcs;
      pxVar12 = vctxt->inode;
      if (pxVar24 != (xmlSchemaIDCPtr_conflict)0x0) {
        if (pxVar12->idcMatchers != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
          pcVar15 = "The chain of IDC matchers is expected to be empty";
LAB_001a4db9:
          pcVar18 = "xmlSchemaIDCRegisterMatchers";
LAB_001a4e20:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,pcVar18,pcVar15,(xmlChar *)0x0,(xmlChar *)in_R8
                    );
          goto LAB_001a4e27;
        }
        ppxVar1 = &vctxt->aidcs;
        pxVar19 = (xmlSchemaIDCMatcherPtr_conflict)0x0;
        do {
          pxVar22 = (xmlSchemaIDCAugPtr_conflict)ppxVar1;
          if ((pxVar24->type == XML_SCHEMA_TYPE_IDC_KEYREF) &&
             (pxVar3 = (xmlSchemaIDCPtr_conflict)pxVar24->ref->item,
             pxVar3 != (xmlSchemaIDCPtr_conflict)0x0)) {
            vctxt->inode->hasKeyrefs = 1;
            pxVar11 = (xmlSchemaIDCAugPtr_conflict)ppxVar1;
            do {
              pxVar11 = pxVar11->next;
              if (pxVar11 == (xmlSchemaIDCAugPtr_conflict)0x0) goto LAB_001a4dab;
            } while (pxVar11->def != pxVar3);
            if (vctxt->depth < pxVar11->keyrefDepth || pxVar11->keyrefDepth == -1) {
              pxVar11->keyrefDepth = vctxt->depth;
            }
          }
          do {
            pxVar22 = pxVar22->next;
            if (pxVar22 == (xmlSchemaIDCAugPtr_conflict)0x0) goto LAB_001a4dab;
          } while (pxVar22->def != pxVar24);
          matcher = vctxt->idcMatcherCache;
          if (matcher == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
            matcher = (xmlSchemaIDCMatcherPtr_conflict)(*xmlMalloc)(0x48);
            if (matcher == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
              xmlSchemaVErrMemory(vctxt);
              goto LAB_001a4e27;
            }
            *(undefined8 *)&matcher->sizeKeySeqs = 0;
            matcher->targets = (xmlSchemaItemListPtr)0x0;
            *(undefined8 *)&matcher->idcType = 0;
            matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)0x0;
            matcher->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
            matcher->aidc = (xmlSchemaIDCAugPtr_conflict)0x0;
            matcher->type = 0;
            matcher->depth = 0;
            matcher->next = (xmlSchemaIDCMatcherPtr)0x0;
            matcher->htab = (xmlHashTablePtr)0x0;
          }
          else {
            vctxt->idcMatcherCache = matcher->nextCached;
            matcher->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
          }
          if (pxVar19 == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
            ppxVar20 = &vctxt->inode->idcMatchers;
          }
          else {
            ppxVar20 = &pxVar19->next;
          }
          *ppxVar20 = matcher;
          matcher->type = 0;
          matcher->depth = vctxt->depth;
          matcher->aidc = pxVar22;
          matcher->idcType = pxVar22->def->type;
          iVar6 = xmlSchemaIDCAddStateObject(vctxt,matcher,pxVar24->selector,1);
          if (iVar6 == -1) goto LAB_001a4e27;
          pxVar24 = pxVar24->next;
          pxVar19 = matcher;
        } while (pxVar24 != (xmlSchemaIDCPtr)0x0);
        pxVar12 = vctxt->inode;
      }
      pxVar12->typeDef = pxVar10;
      goto LAB_001a4ca9;
    }
  }
  else {
    pxVar12 = vctxt->elemInfos[(long)vctxt->depth + -1];
    uVar5 = pxVar12->flags;
    if ((uVar5 & 0x20) != 0) {
      uVar5 = uVar5 & 0xffffffdf;
      pxVar12->flags = uVar5;
    }
    if ((uVar5 & 4) == 0) {
      pxVar10 = pxVar12->typeDef;
      if (pxVar10->builtInType == 0x2d) {
        pxVar9 = xmlSchemaGetElem(vctxt->schema,vctxt->inode->localName,vctxt->inode->nsName);
        pxVar12 = vctxt->inode;
        pxVar12->decl = pxVar9;
        if (pxVar9 == (xmlSchemaElementPtr)0x0) {
          if (0 < (long)vctxt->nbAttrInfos) {
            lVar7 = 0;
            do {
              if (vctxt->attrInfos[lVar7]->metaType == 1) {
                iVar6 = xmlSchemaProcessXSIType
                                  (vctxt,vctxt->attrInfos[lVar7],&pxVar12->typeDef,
                                   (xmlSchemaElementPtr)0x0);
                if (iVar6 == 0) goto switchD_001a451c_caseD_5;
                if (iVar6 != -1) goto LAB_001a44f3;
                pcVar15 = "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:nil\'";
                goto LAB_001a46f2;
              }
              lVar7 = lVar7 + 1;
            } while (vctxt->nbAttrInfos != lVar7);
          }
          pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
          vctxt->inode->typeDef = pxVar10;
        }
      }
      else {
        switch(pxVar10->contentType) {
        case XML_SCHEMA_CONTENT_EMPTY:
          vctxt->inode = pxVar12;
          in_R8 = "Element content is not allowed, because the content type is empty";
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1,
                              (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                              "Element content is not allowed, because the content type is empty",
                              (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          iVar6 = 0x731;
          goto LAB_001a44c2;
        case XML_SCHEMA_CONTENT_ELEMENTS:
        case XML_SCHEMA_CONTENT_MIXED:
          local_a4 = 10;
          if (pxVar10->contModel == (xmlRegexpPtr)0x0) {
            pcVar15 = "type has elem content but no content model";
          }
          else if ((uVar5 >> 8 & 1) == 0) {
            exec = pxVar12->regexCtxt;
            if (exec == (xmlRegExecCtxtPtr)0x0) {
              exec = xmlRegNewExecCtxt(pxVar10->contModel,xmlSchemaVContentModelCallback,vctxt);
              if (exec == (xmlRegExecCtxtPtr)0x0) {
                pcVar15 = "failed to create a regex context";
                goto LAB_001a46f2;
              }
              pxVar12->regexCtxt = exec;
            }
            pxVar13 = vctxt->inode;
            iVar4 = xmlRegExecPushString2(exec,pxVar13->localName,pxVar13->nsName,pxVar13);
            if (vctxt->err != 0x71a) {
              if (iVar4 < 0) {
                in_R8 = (char *)local_88;
                piVar21 = &local_8c;
                xmlRegExecErrInfo(exec,(xmlChar **)0x0,(int *)&local_a4,(int *)&local_90,
                                  (xmlChar **)in_R8,piVar21);
                xmlSchemaComplexTypeErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,0x1e41c5,(xmlNodePtr)(ulong)local_a4,
                           (xmlSchemaTypePtr)(ulong)local_90,in_R8,(int)piVar21,iVar6,
                           in_stack_ffffffffffffff30);
                iVar6 = vctxt->err;
                iVar4 = vctxt->depth;
                pxVar13 = vctxt->inode;
                goto LAB_001a44db;
              }
              break;
            }
            pcVar15 = "calling xmlRegExecPushString2()";
          }
          else {
            pcVar15 = "validating elem, but elem content is already invalid";
          }
LAB_001a46f2:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateChildElem",pcVar15,
                     (xmlChar *)0x0,(xmlChar *)in_R8);
          goto LAB_001a46fc;
        case XML_SCHEMA_CONTENT_SIMPLE:
        case XML_SCHEMA_CONTENT_BASIC:
          vctxt->inode = pxVar12;
          if (pxVar10->type == XML_SCHEMA_TYPE_COMPLEX) {
            in_R8 = 
            "Element content is not allowed, because the content type is a simple type definition";
            xVar17 = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_2;
          }
          else {
            in_R8 = "Element content is not allowed, because the type definition is simple";
            xVar17 = XML_SCHEMAV_CVC_TYPE_3_1_2;
          }
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar17,(xmlNodePtr)0x0,
                              (xmlSchemaBasicItemPtr)0x0,in_R8,(xmlChar *)0x0,(xmlChar *)0x0,
                              (xmlChar *)0x0,(xmlChar *)0x0);
          iVar4 = vctxt->depth;
          pxVar13 = vctxt->elemInfos[iVar4];
          vctxt->inode = pxVar13;
          iVar6 = vctxt->err;
          goto LAB_001a44db;
        }
      }
    }
    else {
      vctxt->inode = pxVar12;
      in_R8 = "Neither character nor element content is allowed, because the element was \'nilled\'"
      ;
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_3_2_1,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,
                          "Neither character nor element content is allowed, because the element was \'nilled\'"
                          ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar6 = 0x738;
LAB_001a44c2:
      iVar4 = vctxt->depth;
      pxVar13 = vctxt->elemInfos[iVar4];
      vctxt->inode = pxVar13;
LAB_001a44db:
      vctxt->skipDepth = iVar4;
      pbVar23 = (byte *)((long)&pxVar13->flags + 1);
      *pbVar23 = *pbVar23 | 2;
      pbVar23 = (byte *)((long)&pxVar12->flags + 1);
      *pbVar23 = *pbVar23 | 1;
      if (iVar6 != 0) {
LAB_001a44f3:
        if (-1 < iVar6) goto LAB_001a4d98;
LAB_001a46fc:
        pcVar18 = "xmlSchemaValidateElem";
        pcVar15 = "calling xmlSchemaStreamValidateChildElement()";
        goto LAB_001a4e35;
      }
    }
switchD_001a451c_caseD_5:
    if (vctxt->depth == vctxt->skipDepth) {
      return 0;
    }
    pxVar12 = vctxt->inode;
    pxVar9 = pxVar12->decl;
    if (pxVar9 != (xmlSchemaElementPtr)0x0) goto LAB_001a473b;
    if (pxVar12->typeDef == (xmlSchemaTypePtr)0x0) {
      pcVar18 = "xmlSchemaValidateElem";
      pcVar15 = "the child element was valid but neither the declaration nor the type was set";
      goto LAB_001a4e35;
    }
LAB_001a4ca9:
    pxVar10 = pxVar12->typeDef;
    if (pxVar10 != (xmlSchemaTypePtr)0x0) {
      if ((pxVar10->flags & 0x100000) != 0) {
        pbVar23 = (byte *)((long)&pxVar12->flags + 1);
        *pbVar23 = *pbVar23 | 4;
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_2,(xmlNodePtr)0x0,
                            (xmlSchemaBasicItemPtr)0x0,"The type definition is abstract",
                            (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
        iVar6 = 0x754;
        goto LAB_001a4d98;
      }
      if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
        iVar6 = xmlSchemaXPathEvaluate(vctxt,XML_ELEMENT_NODE);
        pxVar12 = vctxt->inode;
        pxVar12->appliedXPath = 1;
        if (iVar6 == -1) {
          pcVar18 = "xmlSchemaValidateElem";
          pcVar15 = "calling xmlSchemaXPathEvaluate()";
          goto LAB_001a4e35;
        }
        pxVar10 = pxVar12->typeDef;
      }
      if ((pxVar10->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar10->builtInType == 0x2d)) {
        if ((vctxt->nbAttrInfos == 0) && (pxVar10->attrUses == (void *)0x0)) goto LAB_001a4de3;
        iVar6 = xmlSchemaVAttributesComplex(vctxt);
        bVar25 = iVar6 == -1;
      }
      else {
        if (vctxt->nbAttrInfos != 0) {
          xmlSchemaVAttributesSimple(vctxt);
        }
LAB_001a4de3:
        bVar25 = false;
      }
      if (vctxt->nbAttrInfos != 0) {
        xmlSchemaClearAttrInfos(vctxt);
      }
      if (!bVar25) {
        return 0;
      }
      pcVar18 = "xmlSchemaValidateElem";
      pcVar15 = "calling attributes validation";
LAB_001a4e35:
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)vctxt,pcVar18,pcVar15,(xmlChar *)0x0,(xmlChar *)in_R8);
      return -1;
    }
    pbVar23 = (byte *)((long)&pxVar12->flags + 1);
    *pbVar23 = *pbVar23 | 4;
  }
  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_1,(xmlNodePtr)0x0,
                      (xmlSchemaBasicItemPtr)0x0,"The type definition is absent",(xmlChar *)0x0,
                      (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  iVar6 = 0x753;
LAB_001a4d98:
  vctxt->skipDepth = vctxt->depth;
  return iVar6;
}

Assistant:

static int
xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if ((vctxt->skipDepth != -1) &&
	(vctxt->depth >= vctxt->skipDepth)) {
	VERROR_INT("xmlSchemaValidateElem",
	    "in skip-state");
	goto internal_error;
    }
    if (vctxt->xsiAssemble) {
	/*
	* We will stop validation if there was an error during
	* dynamic schema construction.
	* Note that we simply set @skipDepth to 0, this could
	* mean that a streaming document via SAX would be
	* still read to the end but it won't be validated any more.
	* TODO: If we are sure how to stop the validation at once
	*   for all input scenarios, then this should be changed to
	*   instantly stop the validation.
	*/
	ret = xmlSchemaAssembleByXSI(vctxt);
	if (ret != 0) {
	    if (ret == -1)
		goto internal_error;
	    vctxt->skipDepth = 0;
	    return(ret);
	}
        /*
         * Augment the IDC definitions for the main schema and all imported ones
         * NOTE: main schema is the first in the imported list
         */
        xmlHashScan(vctxt->schema->schemasImports, xmlSchemaAugmentImportedIDC,
                    vctxt);
    }
    if (vctxt->depth > 0) {
	/*
	* Validate this element against the content model
	* of the parent.
	*/
	ret = xmlSchemaValidateChildElem(vctxt);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaStreamValidateChildElement()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (vctxt->depth == vctxt->skipDepth)
	    goto exit;
	if ((vctxt->inode->decl == NULL) &&
	    (vctxt->inode->typeDef == NULL)) {
	    VERROR_INT("xmlSchemaValidateElem",
		"the child element was valid but neither the "
		"declaration nor the type was set");
	    goto internal_error;
	}
    } else {
	/*
	* Get the declaration of the validation root.
	*/
	vctxt->inode->decl = xmlSchemaGetElem(vctxt->schema,
	    vctxt->inode->localName,
	    vctxt->inode->nsName);
	if (vctxt->inode->decl == NULL) {
	    ret = XML_SCHEMAV_CVC_ELT_1;
	    VERROR(ret, NULL,
		"No matching global declaration available "
		"for the validation root");
	    goto exit;
	}
    }

    if (vctxt->inode->decl == NULL)
	goto type_validation;

    if (vctxt->inode->decl->type == XML_SCHEMA_TYPE_ANY) {
	int skip;
	/*
	* Wildcards.
	*/
	ret = xmlSchemaValidateElemWildcard(vctxt, &skip);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaValidateElemWildcard()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (skip) {
	    vctxt->skipDepth = vctxt->depth;
	    goto exit;
	}
	/*
	* The declaration might be set by the wildcard validation,
	* when the processContents is "lax" or "strict".
	*/
	if (vctxt->inode->decl->type != XML_SCHEMA_TYPE_ELEMENT) {
	    /*
	    * Clear the "decl" field to not confuse further processing.
	    */
	    vctxt->inode->decl = NULL;
	    goto type_validation;
	}
    }
    /*
    * Validate against the declaration.
    */
    ret = xmlSchemaValidateElemDecl(vctxt);
    if (ret != 0) {
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaValidateElemDecl()");
	    goto internal_error;
	}
	goto exit;
    }
    /*
    * Validate against the type definition.
    */
type_validation:

    if (vctxt->inode->typeDef == NULL) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_1;
	VERROR(ret, NULL,
	    "The type definition is absent");
	goto exit;
    }
    if (vctxt->inode->typeDef->flags & XML_SCHEMAS_TYPE_ABSTRACT) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_2;
	    VERROR(ret, NULL,
	    "The type definition is abstract");
	goto exit;
    }
    /*
    * Evaluate IDCs. Do it here, since new IDC matchers are registered
    * during validation against the declaration. This must be done
    * _before_ attribute validation.
    */
    if (vctxt->xpathStates != NULL) {
	ret = xmlSchemaXPathEvaluate(vctxt, XML_ELEMENT_NODE);
	vctxt->inode->appliedXPath = 1;
	if (ret == -1) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaXPathEvaluate()");
	    goto internal_error;
	}
    }
    /*
    * Validate attributes.
    */
    if (WXS_IS_COMPLEX(vctxt->inode->typeDef)) {
	if ((vctxt->nbAttrInfos != 0) ||
	    (vctxt->inode->typeDef->attrUses != NULL)) {

	    ret = xmlSchemaVAttributesComplex(vctxt);
	}
    } else if (vctxt->nbAttrInfos != 0) {

	ret = xmlSchemaVAttributesSimple(vctxt);
    }
    /*
    * Clear registered attributes.
    */
    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (ret == -1) {
	VERROR_INT("xmlSchemaValidateElem",
	    "calling attributes validation");
	goto internal_error;
    }
    /*
    * Don't return an error if attributes are invalid on purpose.
    */
    ret = 0;

exit:
    if (ret != 0)
	vctxt->skipDepth = vctxt->depth;
    return (ret);
internal_error:
    return (-1);
}